

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::IStreamingReporter::listTests
          (IStreamingReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *config)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  reference this_00;
  Column *pCVar5;
  size_type sVar6;
  allocator<char> local_1e1;
  string local_1e0;
  pluralise local_1c0;
  allocator<char> local_191;
  string local_190;
  pluralise local_170;
  string local_148;
  Column local_128;
  string local_f0;
  Column local_d0;
  Column local_98;
  Colour local_4d;
  Code local_4c;
  Colour colourGuard;
  TestCaseInfo *pTStack_48;
  Code colour;
  TestCaseInfo *testCaseInfo;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  IConfig *config_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests_local;
  IStreamingReporter *this_local;
  
  uVar2 = (*config->_vptr_IConfig[0xe])();
  if ((uVar2 & 1) == 0) {
    poVar4 = cout();
    std::operator<<(poVar4,"All available test cases:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<(poVar4,"Matching test cases:\n");
  }
  __end1 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin(tests);
  test = (TestCaseHandle *)
         std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end(tests);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                *)&test);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
              ::operator*(&__end1);
    pTStack_48 = TestCaseHandle::getTestCaseInfo(this_00);
    bVar1 = TestCaseInfo::isHidden(pTStack_48);
    local_4c = None;
    if (bVar1) {
      local_4c = FileName;
    }
    Colour::Colour(&local_4d,local_4c);
    poVar4 = cout();
    TextFlow::Column::Column(&local_98,&pTStack_48->name);
    pCVar5 = TextFlow::Column::initialIndent(&local_98,2);
    pCVar5 = TextFlow::Column::indent(pCVar5,4);
    poVar4 = TextFlow::operator<<(poVar4,pCVar5);
    std::operator<<(poVar4,'\n');
    TextFlow::Column::~Column(&local_98);
    iVar3 = (*config->_vptr_IConfig[0x14])();
    if (1 < iVar3) {
      poVar4 = cout();
      Detail::stringify<Catch::SourceLineInfo>(&local_f0,&pTStack_48->lineInfo);
      TextFlow::Column::Column(&local_d0,&local_f0);
      pCVar5 = TextFlow::Column::indent(&local_d0,4);
      poVar4 = TextFlow::operator<<(poVar4,pCVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      TextFlow::Column::~Column(&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    bVar1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::empty(&pTStack_48->tags);
    if (!bVar1) {
      iVar3 = (*config->_vptr_IConfig[0x14])();
      if (0 < iVar3) {
        poVar4 = cout();
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_148,pTStack_48);
        TextFlow::Column::Column(&local_128,&local_148);
        pCVar5 = TextFlow::Column::indent(&local_128,6);
        poVar4 = TextFlow::operator<<(poVar4,pCVar5);
        std::operator<<(poVar4,'\n');
        TextFlow::Column::~Column(&local_128);
        std::__cxx11::string::~string((string *)&local_148);
      }
    }
    Colour::~Colour(&local_4d);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&__end1);
  }
  uVar2 = (*config->_vptr_IConfig[0xe])();
  if ((uVar2 & 1) == 0) {
    poVar4 = cout();
    sVar6 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size(tests);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"test case",&local_191);
    pluralise::pluralise(&local_170,sVar6,&local_190);
    poVar4 = Catch::operator<<(poVar4,&local_170);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  else {
    poVar4 = cout();
    sVar6 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size(tests);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"matching test case",&local_1e1);
    pluralise::pluralise(&local_1c0,sVar6,&local_1e0);
    poVar4 = Catch::operator<<(poVar4,&local_1c0);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
  }
  return;
}

Assistant:

void IStreamingReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &config) {
        if (config.hasTestFilters()) {
            Catch::cout() << "Matching test cases:\n";
        }
        else {
            Catch::cout() << "All available test cases:\n";
        }

        for (auto const &test : tests) {
            auto const &testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard(colour);

            Catch::cout() << TextFlow::Column(testCaseInfo.name).initialIndent(2).indent(4) << '\n';
            if (config.verbosity() >= Verbosity::High) {
                Catch::cout() << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << std::endl;
            }
            if (!testCaseInfo.tags.empty() && config.verbosity() > Verbosity::Quiet) {
                Catch::cout() << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (!config.hasTestFilters()) {
            Catch::cout() << pluralise(tests.size(), "test case") << '\n' << std::endl;
        }
        else {
            Catch::cout() << pluralise(tests.size(), "matching test case") << '\n' << std::endl;
        }
    }